

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.cpp
# Opt level: O1

void __thiscall pstore::storage::protect(storage *this,address first,address last)

{
  pointer psVar1;
  element_type *peVar2;
  unsigned_long b;
  uint64_t uVar3;
  uint64_t uVar4;
  ulong uVar5;
  int line;
  ulong uVar6;
  pointer psVar7;
  ulong uVar8;
  shared_ptr<unsigned_char> pfirst;
  char *local_58;
  _Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false> local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  b = memory_mapper_base::page_size
                ((this->page_size_)._M_t.
                 super___uniq_ptr_impl<pstore::system_page_size_interface,_std::default_delete<pstore::system_page_size_interface>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_pstore::system_page_size_interface_*,_std::default_delete<pstore::system_page_size_interface>_>
                 .super__Head_base<0UL,_pstore::system_page_size_interface_*,_false>._M_head_impl);
  if ((int)POPCOUNT(b) != 1) {
    assert_failed("page_size > 0 && is_power_of_two (page_size)",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/storage.cpp"
                  ,0xbf);
  }
  uVar3 = anon_unknown.dwarf_28da71::round_down(first.a_,b);
  uVar4 = anon_unknown.dwarf_28da71::round_down(b + 0x3f,b);
  if (uVar4 < uVar3) {
    uVar4 = uVar3;
  }
  uVar3 = anon_unknown.dwarf_28da71::round_down(last.a_,b);
  psVar1 = (this->regions_).
           super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar7 = (this->regions_).
           super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar7 != psVar1) {
    local_58 = "pfirst >= region->data ()";
    do {
      peVar2 = psVar7[-1].super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      uVar5 = peVar2->offset_;
      if (uVar5 % b != 0) {
        assert_failed("region->offset () % page_size == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/storage.cpp"
                      ,0xc9);
      }
      uVar6 = uVar4;
      if (uVar4 < uVar5) {
        uVar6 = uVar5;
      }
      uVar5 = uVar5 + peVar2->size_;
      uVar8 = uVar5;
      if (uVar3 < uVar5) {
        uVar8 = uVar3;
      }
      if (uVar5 < uVar6) {
        return;
      }
      psVar7 = psVar7 + -1;
      if (uVar6 <= uVar8 && uVar8 - uVar6 != 0) {
        address_to_pointer<unsigned_char>((storage *)&local_40,(typed_address<unsigned_char>)this);
        peVar2 = (psVar7->super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        if (local_40._M_head_impl <
            (array<pstore::sat_entry,_65536UL> *)
            (peVar2->ptr_).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
          line = 0xd6;
LAB_0016158f:
          assert_failed(local_58,
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/storage.cpp"
                        ,line);
        }
        if (peVar2->size_ < uVar8 - peVar2->offset_) {
          line = 0xd7;
          local_58 = "last_offset - region->offset () <= region->size ()";
          goto LAB_0016158f;
        }
        (*peVar2->_vptr_memory_mapper_base[2])(peVar2,local_40._M_head_impl,uVar8 - uVar6);
        if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
        }
      }
    } while (psVar7 != psVar1);
  }
  return;
}

Assistant:

void storage::protect (address first, address last) {
        std::uint64_t const page_size = memory_mapper::page_size (*page_size_);
        PSTORE_ASSERT (page_size > 0 && is_power_of_two (page_size));

        first = std::max (round_down (first, page_size),
                          address{round_down (leader_size + page_size - 1U, page_size)});
        last = round_down (last, page_size);

        auto const end = regions_.rend ();
        for (auto region_it = regions_.rbegin (); region_it != end; ++region_it) {
            std::shared_ptr<memory_mapper_base> & region = *region_it;

            PSTORE_ASSERT (region->offset () % page_size == 0);
            std::uint64_t const first_offset = std::max (region->offset (), first.absolute ());
            std::uint64_t const last_offset =
                std::min (region->offset () + region->size (), last.absolute ());

            if (region->offset () + region->size () < first_offset) {
                break;
            }

            if (first_offset >= first.absolute () && last_offset > first_offset) {
                auto const pfirst =
                    this->address_to_pointer (typed_address<std::uint8_t>::make (first_offset));

                PSTORE_ASSERT (pfirst >= region->data ());
                PSTORE_ASSERT (last_offset - region->offset () <= region->size ());

                region->read_only (pfirst.get (), last_offset - first_offset);
            }
        }
    }